

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCues.cpp
# Opt level: O0

bool __thiscall libmatroska::KaxCues::AddBlockBlob(KaxCues *this,KaxBlockBlob *BlockReference)

{
  bool bVar1;
  reference ppKVar2;
  value_type local_40;
  __normal_iterator<const_libmatroska::KaxBlockBlob_**,_std::vector<const_libmatroska::KaxBlockBlob_*,_std::allocator<const_libmatroska::KaxBlockBlob_*>_>_>
  local_38;
  KaxBlockBlob **local_30;
  __normal_iterator<const_libmatroska::KaxBlockBlob_**,_std::vector<const_libmatroska::KaxBlockBlob_*,_std::allocator<const_libmatroska::KaxBlockBlob_*>_>_>
  local_28;
  iterator ListIdx;
  KaxBlockBlob *BlockReference_local;
  KaxCues *this_local;
  
  ListIdx._M_current = (KaxBlockBlob **)BlockReference;
  __gnu_cxx::
  __normal_iterator<const_libmatroska::KaxBlockBlob_**,_std::vector<const_libmatroska::KaxBlockBlob_*,_std::allocator<const_libmatroska::KaxBlockBlob_*>_>_>
  ::__normal_iterator(&local_28);
  local_30 = (KaxBlockBlob **)
             std::
             vector<const_libmatroska::KaxBlockBlob_*,_std::allocator<const_libmatroska::KaxBlockBlob_*>_>
             ::begin(&this->myTempReferences);
  local_28._M_current = local_30;
  while( true ) {
    local_38._M_current =
         (KaxBlockBlob **)
         std::
         vector<const_libmatroska::KaxBlockBlob_*,_std::allocator<const_libmatroska::KaxBlockBlob_*>_>
         ::end(&this->myTempReferences);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar1) {
      local_40 = (value_type)ListIdx._M_current;
      std::
      vector<const_libmatroska::KaxBlockBlob_*,_std::allocator<const_libmatroska::KaxBlockBlob_*>_>
      ::push_back(&this->myTempReferences,&local_40);
      return true;
    }
    ppKVar2 = __gnu_cxx::
              __normal_iterator<const_libmatroska::KaxBlockBlob_**,_std::vector<const_libmatroska::KaxBlockBlob_*,_std::allocator<const_libmatroska::KaxBlockBlob_*>_>_>
              ::operator*(&local_28);
    if (*ppKVar2 == (KaxBlockBlob *)ListIdx._M_current) break;
    __gnu_cxx::
    __normal_iterator<const_libmatroska::KaxBlockBlob_**,_std::vector<const_libmatroska::KaxBlockBlob_*,_std::allocator<const_libmatroska::KaxBlockBlob_*>_>_>
    ::operator++(&local_28);
  }
  return true;
}

Assistant:

bool KaxCues::AddBlockBlob(const KaxBlockBlob & BlockReference)
{
  // Do not add the element if it's already present.
  std::vector<const KaxBlockBlob *>::iterator ListIdx;

  for (ListIdx = myTempReferences.begin(); ListIdx != myTempReferences.end(); ++ListIdx)
    if (*ListIdx == &BlockReference)
      return true;

  myTempReferences.push_back(&BlockReference);
  return true;
}